

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O3

int gzclose_w(gzFile file)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = -2;
  if ((file != (gzFile)0x0) && (*file == 0x79b1)) {
    if (*(int *)((long)file + 0x68) == 0) {
      iVar1 = 0;
    }
    else {
      *(undefined4 *)((long)file + 0x68) = 0;
      iVar1 = gz_zero((gz_statep)file,*(long *)((long)file + 0x60));
    }
    iVar2 = gz_comp((gz_statep)file,4);
    deflateEnd((z_streamp_conflict)((long)file + 0x78));
    free(*(void **)((long)file + 0x28));
    free(*(void **)((long)file + 0x20));
    gz_error((gz_statep)file,0,(char *)0x0);
    free(*(void **)((long)file + 8));
    iVar3 = close(*(int *)((long)file + 4));
    free(file);
    iVar1 = -(uint)(iVar3 + iVar2 + iVar1 != 0);
  }
  return iVar1;
}

Assistant:

int ZEXPORT gzclose_w(gzFile file)
{
    int ret = 0;
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return Z_STREAM_ERROR;
    state = (gz_statep)file;

    /* check that we're writing */
    if (state->mode != GZ_WRITE)
        return Z_STREAM_ERROR;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        ret += gz_zero(state, state->skip);
    }

    /* flush, free memory, and close file */
    ret += gz_comp(state, Z_FINISH);
    (void)deflateEnd(&(state->strm));
    free(state->out);
    free(state->in);
    gz_error(state, Z_OK, NULL);
    free(state->path);
    ret += close(state->fd);
    free(state);
    return ret ? Z_ERRNO : Z_OK;
}